

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O2

void __thiscall FIX::RepeatedTag::RepeatedTag(RepeatedTag *this,int field,string *what)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Repeated tag not part of repeating group",&local_41);
  Exception::Exception(&this->super_Exception,&local_40,what);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Exception = &PTR__Exception_001fc978;
  this->field = field;
  return;
}

Assistant:

RepeatedTag(int field = 0, const std::string &what = "")
      : Exception("Repeated tag not part of repeating group", what),
        field(field) {}